

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleRowDown38_2_Box_C(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  long lVar1;
  byte *pbVar2;
  
  pbVar2 = src_ptr + 7;
  for (lVar1 = 0; (int)lVar1 < dst_width; lVar1 = lVar1 + 3) {
    dst_ptr[lVar1] =
         (uint8_t)(((uint)pbVar2[src_stride + -5] + (uint)pbVar2[src_stride + -6] +
                   (uint)pbVar2[src_stride + -7] + (uint)pbVar2[-5] +
                   (uint)pbVar2[-6] + (uint)pbVar2[-7]) * 0x2aaa >> 0x10);
    dst_ptr[lVar1 + 1] =
         (uint8_t)(((uint)pbVar2[src_stride + -2] + (uint)pbVar2[src_stride + -3] +
                   (uint)pbVar2[src_stride + -4] + (uint)pbVar2[-2] +
                   (uint)pbVar2[-3] + (uint)pbVar2[-4]) * 0x2aaa >> 0x10);
    dst_ptr[lVar1 + 2] =
         (uint8_t)((uint)pbVar2[src_stride] + (uint)pbVar2[src_stride + -1] +
                   (uint)*pbVar2 + (uint)pbVar2[-1] >> 2);
    pbVar2 = pbVar2 + 8;
  }
  return;
}

Assistant:

void ScaleRowDown38_2_Box_C(const uint8_t* src_ptr,
                            ptrdiff_t src_stride,
                            uint8_t* dst_ptr,
                            int dst_width) {
  intptr_t stride = src_stride;
  int i;
  assert((dst_width % 3 == 0) && (dst_width > 0));
  for (i = 0; i < dst_width; i += 3) {
    dst_ptr[0] = (src_ptr[0] + src_ptr[1] + src_ptr[2] + src_ptr[stride + 0] +
                  src_ptr[stride + 1] + src_ptr[stride + 2]) *
                     (65536 / 6) >>
                 16;
    dst_ptr[1] = (src_ptr[3] + src_ptr[4] + src_ptr[5] + src_ptr[stride + 3] +
                  src_ptr[stride + 4] + src_ptr[stride + 5]) *
                     (65536 / 6) >>
                 16;
    dst_ptr[2] =
        (src_ptr[6] + src_ptr[7] + src_ptr[stride + 6] + src_ptr[stride + 7]) *
            (65536 / 4) >>
        16;
    src_ptr += 8;
    dst_ptr += 3;
  }
}